

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O1

void Amap_RemoveComments(char *pBuffer,int *pnDots,int *pnLines)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pCur;
  
  iVar3 = 0;
  iVar2 = 0;
  do {
    if (*pBuffer == '#') {
      cVar1 = *pBuffer;
      while (cVar1 != '\n') {
        *pBuffer = ' ';
        cVar1 = pBuffer[1];
        pBuffer = pBuffer + 1;
      }
    }
    else if (*pBuffer == '\0') {
      if (pnDots != (int *)0x0) {
        *pnDots = iVar3;
      }
      if (pnLines != (int *)0x0) {
        *pnLines = iVar2;
      }
      return;
    }
    if (*pBuffer == '.') {
      iVar3 = iVar3 + 1;
    }
    else if (*pBuffer == '\n') {
      if (pBuffer[-1] == '\\') {
        pBuffer[-1] = ' ';
        pBuffer[0] = ' ';
      }
      else if ((pBuffer[-1] == '\r') && (pBuffer[-2] == '\\')) {
        pBuffer[-2] = ' ';
        pBuffer[-1] = ' ';
        *pBuffer = ' ';
      }
      else {
        iVar2 = iVar2 + 1;
      }
    }
    pBuffer = pBuffer + 1;
  } while( true );
}

Assistant:

void Amap_RemoveComments( char * pBuffer, int * pnDots, int * pnLines )
{
    char * pCur;
    int nDots, nLines;
    // scan through the buffer and eliminate comments
    // (in the BLIF file, comments are lines starting with "#")
    nDots = nLines = 0;
    for ( pCur = pBuffer; *pCur; pCur++ )
    {
        // if this is the beginning of comment
        // clean it with spaces until the new line statement
        if ( *pCur == '#' )
            while ( *pCur != '\n' )
                *pCur++ = ' ';
	
        // count the number of new lines and dots
        if ( *pCur == '\n' ) {
	    if (*(pCur-1)=='\r') {
		// DOS(R) file support
		if (*(pCur-2)!='\\') nLines++;
		else {
		    // rewind to backslash and overwrite with a space
		    *(pCur-2) = ' ';
		    *(pCur-1) = ' ';
		    *pCur = ' ';
		}
	    } else {
		// UNIX(TM) file support
		if (*(pCur-1)!='\\') nLines++;
		else {
		    // rewind to backslash and overwrite with a space
		    *(pCur-1) = ' ';
		    *pCur = ' ';
		}
	    }
	}
        else if ( *pCur == '.' )
            nDots++;
    }
    if ( pnDots )
        *pnDots = nDots; 
    if ( pnLines )
        *pnLines = nLines; 
}